

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O0

void __thiscall
wabt::intrusive_list<(anonymous_namespace)::TestObject>::clear
          (intrusive_list<(anonymous_namespace)::TestObject> *this)

{
  TestObject *pTVar1;
  TestObject *next;
  TestObject *iter;
  intrusive_list<(anonymous_namespace)::TestObject> *this_local;
  
  pTVar1 = this->first_;
  while (next = pTVar1, next != (TestObject *)0x0) {
    pTVar1 = (next->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
    if (next != (TestObject *)0x0) {
      anon_unknown.dwarf_4eaaf::TestObject::~TestObject(next);
      operator_delete(next);
    }
  }
  this->last_ = (TestObject *)0x0;
  this->first_ = (TestObject *)0x0;
  this->size_ = 0;
  return;
}

Assistant:

inline void intrusive_list<T>::clear() noexcept {
  for (T* iter = first_; iter;) {
    T* next = iter->next_;
    delete iter;
    iter = next;
  }
  first_ = last_ = nullptr;
  size_ = 0;
}